

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O1

void __thiscall
limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
          (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *this,
          pair<unsigned_long,_const_cppjieba::DictUnit_*> *t)

{
  size_t sVar1;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *ppVar2;
  
  sVar1 = this->capacity_;
  if (this->size_ == sVar1) {
    if (sVar1 == 0) {
      __assert_fail("capacity_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/deps/limonp/LocalVector.hpp"
                    ,0x52,
                    "void limonp::LocalVector<std::pair<unsigned long, const cppjieba::DictUnit *>>::push_back(const T &) [T = std::pair<unsigned long, const cppjieba::DictUnit *>]"
                   );
    }
    reserve(this,sVar1 * 2);
  }
  ppVar2 = this->ptr_;
  sVar1 = this->size_;
  this->size_ = sVar1 + 1;
  ppVar2[sVar1].first = t->first;
  ppVar2[sVar1].second = t->second;
  return;
}

Assistant:

void push_back(const T& t) {
    if(size_ == capacity_) {
      assert(capacity_);
      reserve(capacity_ * 2);
    }
    ptr_[size_ ++ ] = t;
  }